

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::writeScene(Application *this,char *filename)

{
  size_t sVar1;
  Application *this_00;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Writing scene to file ",0x16);
  if (filename == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x31ebc8);
  }
  else {
    sVar1 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  this_00 = (Application *)this->scene;
  Collada::ColladaWriter::writeScene((Scene *)this_00,filename);
  writeSkeleton(this_00,filename,this->scene);
  return;
}

Assistant:

void Application::writeScene( const char* filename )
{
   cerr << "Writing scene to file " << filename << endl;
   Collada::ColladaWriter::writeScene( *scene, filename );
   writeSkeleton(filename, scene);
}